

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.cpp
# Opt level: O2

bool __thiscall HTTPServerPlugin::initialize(HTTPServerPlugin *this)

{
  unsigned_short uVar1;
  undefined1 extraout_AL;
  bool bVar2;
  undefined1 extraout_AH;
  undefined6 extraout_var;
  undefined8 extraout_RDX;
  string_view in_key;
  
  Jupiter::Config::get(&this->field_0x38,0xb,"BindAddress",7,"0.0.0.0");
  in_key._M_str = "BindPort";
  in_key._M_len = 8;
  uVar1 = Jupiter::Config::get<unsigned_short>((Config *)&this->field_0x38,in_key,0x50);
  bVar2 = (bool)Jupiter::HTTP::Server::bind
                          (&this->server,CONCAT62(extraout_var,CONCAT11(extraout_AH,extraout_AL)),
                           extraout_RDX,uVar1);
  return bVar2;
}

Assistant:

bool HTTPServerPlugin::initialize() {
	return HTTPServerPlugin::server.bind(this->config.get("BindAddress"sv, "0.0.0.0"sv), this->config.get<uint16_t>("BindPort"sv, 80));
}